

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O2

void __thiscall CGameClient::OnPredict(CGameClient *this)

{
  uint uVar1;
  long lVar2;
  CNetObj_GameData *pCVar3;
  CCharacterCore *pCVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  CTuneParam CVar9;
  int iVar10;
  IClient *pIVar11;
  undefined4 extraout_var;
  long lVar13;
  CNetObj_CharacterCore *pCVar14;
  CCharacterCore *pCVar15;
  CTuningParams *pCVar16;
  CCharacterCore *pCVar17;
  CWorldCore *pCVar18;
  CCharacterCore *pCVar19;
  int c;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  long in_FS_OFFSET;
  bool bVar24;
  byte bVar25;
  CWorldCore World;
  undefined8 *puVar12;
  
  bVar25 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = (this->m_Snap).m_pGameData;
  if ((pCVar3 == (CNetObj_GameData *)0x0) || ((pCVar3->m_GameStateFlags & 0x1c) == 0)) {
    CWorldCore::CWorldCore(&World);
    lVar23 = 0x10;
    pCVar16 = &this->m_Tuning;
    pCVar18 = &World;
    for (lVar13 = lVar23; lVar13 != 0; lVar13 = lVar13 + -1) {
      CVar9.m_Value = (pCVar16->m_GroundControlAccel).m_Value;
      (pCVar18->m_Tuning).m_GroundControlSpeed = (CTuneParam)(pCVar16->m_GroundControlSpeed).m_Value
      ;
      (pCVar18->m_Tuning).m_GroundControlAccel = (CTuneParam)CVar9.m_Value;
      pCVar16 = (CTuningParams *)((long)pCVar16 + (ulong)bVar25 * -0x10 + 8);
      pCVar18 = (CWorldCore *)((long)pCVar18 + (ulong)bVar25 * -0x10 + 8);
    }
    pCVar14 = &(this->m_Snap).m_aCharacters[0].m_Cur.super_CNetObj_CharacterCore;
    pCVar15 = &this->m_aClients[0].m_Predicted;
    for (; lVar23 != 0x50; lVar23 = lVar23 + 1) {
      if ((char)pCVar14[-2].m_Jumped == '\x01') {
        CCharacterCore::Init(pCVar15,&World,&this->m_Collision);
        World.m_apCharacters[lVar23 + -0x10] = pCVar15;
        CCharacterCore::Read(pCVar15,pCVar14);
      }
      pCVar14 = (CNetObj_CharacterCore *)&pCVar14[3].m_Y;
      pCVar15 = (CCharacterCore *)&pCVar15[0xb].m_HookDir;
    }
    pIVar11 = this->m_pClient;
    uVar21 = pIVar11->m_CurGameTick;
    while ((int)uVar21 < pIVar11->m_PredTick) {
      uVar22 = uVar21 + 1;
      pCVar15 = &this->m_aClients[0].m_PrevPredicted;
      for (uVar20 = 0; uVar20 != 0x40; uVar20 = uVar20 + 1) {
        pCVar4 = World.m_apCharacters[uVar20];
        if (pCVar4 != (CCharacterCore *)0x0) {
          if (uVar22 == this->m_pClient->m_PredTick) {
            pCVar17 = pCVar4;
            pCVar19 = pCVar15;
            for (lVar23 = 0x10; lVar23 != 0; lVar23 = lVar23 + -1) {
              pCVar19->m_pWorld = pCVar17->m_pWorld;
              pCVar17 = (CCharacterCore *)((long)pCVar17 + ((ulong)bVar25 * -2 + 1) * 8);
              pCVar19 = (CCharacterCore *)((long)pCVar19 + (ulong)bVar25 * -0x10 + 8);
            }
          }
          mem_zero(&pCVar4->m_Input,0x28);
          uVar1 = this->m_LocalClientID;
          if (uVar20 == uVar1) {
            iVar10 = (*(this->m_pClient->super_IInterface)._vptr_IInterface[0x18])
                               (this->m_pClient,(ulong)uVar22);
            puVar12 = (undefined8 *)CONCAT44(extraout_var,iVar10);
            if (puVar12 != (undefined8 *)0x0) {
              pCVar4 = World.m_apCharacters[uVar20];
              uVar5 = puVar12[4];
              (pCVar4->m_Input).m_NextWeapon = (int)uVar5;
              (pCVar4->m_Input).m_PrevWeapon = (int)((ulong)uVar5 >> 0x20);
              uVar5 = *puVar12;
              uVar6 = puVar12[1];
              uVar7 = puVar12[2];
              uVar8 = puVar12[3];
              (pCVar4->m_Input).m_Fire = (int)uVar7;
              (pCVar4->m_Input).m_Hook = (int)((ulong)uVar7 >> 0x20);
              (pCVar4->m_Input).m_PlayerFlags = (int)uVar8;
              (pCVar4->m_Input).m_WantedWeapon = (int)((ulong)uVar8 >> 0x20);
              (pCVar4->m_Input).m_Direction = (int)uVar5;
              (pCVar4->m_Input).m_TargetX = (int)((ulong)uVar5 >> 0x20);
              (pCVar4->m_Input).m_TargetY = (int)uVar6;
              (pCVar4->m_Input).m_Jump = (int)((ulong)uVar6 >> 0x20);
            }
          }
          CCharacterCore::Tick(World.m_apCharacters[uVar20],uVar20 == uVar1);
        }
        pCVar15 = (CCharacterCore *)((long)(pCVar15 + 0xb) + 0x30);
      }
      for (lVar23 = 0; lVar23 != 0x40; lVar23 = lVar23 + 1) {
        if (World.m_apCharacters[lVar23] != (CCharacterCore *)0x0) {
          CCharacterCore::AddDragVelocity(World.m_apCharacters[lVar23]);
          CCharacterCore::ResetDragVelocity(World.m_apCharacters[lVar23]);
          CCharacterCore::Move(World.m_apCharacters[lVar23]);
          CCharacterCore::Quantize(World.m_apCharacters[lVar23]);
        }
      }
      if (this->m_LastNewPredictedTick <= (int)uVar21) {
        this->m_LastNewPredictedTick = uVar22;
        if (((long)this->m_LocalClientID != -1) &&
           (pCVar15 = World.m_apCharacters[this->m_LocalClientID], pCVar15 != (CCharacterCore *)0x0)
           ) {
          ProcessTriggeredEvents(this,pCVar15->m_TriggeredEvents,pCVar15->m_Pos);
        }
      }
      uVar21 = uVar22;
      pIVar11 = this->m_pClient;
    }
    this->m_PredictedTick = pIVar11->m_PredTick;
  }
  else {
    pCVar15 = &this->m_aClients[0].m_Predicted;
    pCVar14 = &(this->m_Snap).m_aCharacters[0].m_Cur.super_CNetObj_CharacterCore;
    lVar23 = 0x40;
    while (bVar24 = lVar23 != 0, lVar23 = lVar23 + -1, bVar24) {
      if ((char)pCVar14[-2].m_Jumped == '\x01') {
        CCharacterCore::Read(pCVar15 + 1,(CNetObj_CharacterCore *)&pCVar14[-2].m_HookedPlayer);
        CCharacterCore::Read(pCVar15,pCVar14);
      }
      pCVar15 = (CCharacterCore *)&pCVar15[0xb].m_HookDir;
      pCVar14 = (CNetObj_CharacterCore *)&pCVar14[3].m_Y;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameClient::OnPredict()
{
	// Here we predict player movements. For the local player, we also predict
	// the result of the local input to make the game appear responsive even at
	// high latencies. For non-local players, we predict what will happen if
	// they don't apply any inputs. In both cases we are extrapolating
	// (predicting) what will happen between `GameTick` and `PredGameTick`.

	// don't predict anything if we are paused or round/game is over
	if(IsWorldPaused())
	{
		for(int i = 0; i < MAX_CLIENTS; i++)
		{
			if(!m_Snap.m_aCharacters[i].m_Active)
				continue;

			// instead of predicting into the future, just use the current and
			// previous snapshots that we already have
			m_aClients[i].m_PrevPredicted.Read(&m_Snap.m_aCharacters[i].m_Prev);
			m_aClients[i].m_Predicted.Read(&m_Snap.m_aCharacters[i].m_Cur);
		}

		return;
	}

	// repredict character
	CWorldCore World;
	World.m_Tuning = m_Tuning;

	// search for players
	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(!m_Snap.m_aCharacters[i].m_Active)
			continue;

		m_aClients[i].m_Predicted.Init(&World, Collision());
		World.m_apCharacters[i] = &m_aClients[i].m_Predicted;
		m_aClients[i].m_Predicted.Read(&m_Snap.m_aCharacters[i].m_Cur);
	}

	// predict
	for(int Tick = Client()->GameTick() + 1;
		Tick <= Client()->PredGameTick();
		Tick++)
	{
		// first calculate where everyone should move
		for(int c = 0; c < MAX_CLIENTS; c++)
		{
			if(!World.m_apCharacters[c])
				continue;

			// Before running the last iteration, store our predictions. We use
			// `Prev` because we haven't run the last iteration yet, so our
			// data is from the previous tick.
			if(Tick == Client()->PredGameTick())
				m_aClients[c].m_PrevPredicted = *World.m_apCharacters[c];

			mem_zero(&World.m_apCharacters[c]->m_Input, sizeof(World.m_apCharacters[c]->m_Input));

			if(m_LocalClientID == c)
			{
				// apply player input
				const int *pInput = Client()->GetInput(Tick);
				if(pInput)
					World.m_apCharacters[c]->m_Input = *((const CNetObj_PlayerInput*)pInput);

				World.m_apCharacters[c]->Tick(true);
			}
			else
			{
				// don't apply inputs for non-local players
				World.m_apCharacters[c]->Tick(false);
			}
		}

		// move all players and quantize their data
		for(int c = 0; c < MAX_CLIENTS; c++)
		{
			if (!World.m_apCharacters[c])
				continue;

			World.m_apCharacters[c]->AddDragVelocity();
			World.m_apCharacters[c]->ResetDragVelocity();
			World.m_apCharacters[c]->Move();
			World.m_apCharacters[c]->Quantize();
		}

		// check if we want to trigger effects
		if(Tick > m_LastNewPredictedTick)
		{
			m_LastNewPredictedTick = Tick;

			// Only trigger effects for the local character here. Effects for
			// non-local characters are triggered in `OnNewSnapshot`. Since we
			// don't apply any inputs to non-local characters, it's not
			// necessary to trigger events for them here. Also, our predictions
			// for other players will often be wrong, so it's safer not to
			// trigger events here.
			if(m_LocalClientID != -1 && World.m_apCharacters[m_LocalClientID])
			{
				ProcessTriggeredEvents(
					World.m_apCharacters[m_LocalClientID]->m_TriggeredEvents,
					World.m_apCharacters[m_LocalClientID]->m_Pos
				);
			}
		}
	}

	m_PredictedTick = Client()->PredGameTick();
}